

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

int evutil_make_socket_nonblocking(int fd)

{
  uint uVar1;
  int iVar2;
  char *fmt;
  
  uVar1 = fcntl(fd,3,0);
  if ((int)uVar1 < 0) {
    fmt = "fcntl(%d, F_GETFL)";
  }
  else {
    if ((uVar1 >> 0xb & 1) != 0) {
      return 0;
    }
    iVar2 = fcntl(fd,4,(ulong)(uVar1 | 0x800));
    if (iVar2 != -1) {
      return 0;
    }
    fmt = "fcntl(%d, F_SETFL)";
  }
  event_warn(fmt,fd);
  return -1;
}

Assistant:

int
evutil_make_socket_nonblocking(evutil_socket_t fd)
{
#ifdef _WIN32
	{
		unsigned long nonblocking = 1;
		if (ioctlsocket(fd, FIONBIO, &nonblocking) == SOCKET_ERROR) {
			event_sock_warn(fd, "fcntl(%d, F_GETFL)", (int)fd);
			return -1;
		}
	}
#else
	{
		int flags;
		if ((flags = fcntl(fd, F_GETFL, NULL)) < 0) {
			event_warn("fcntl(%d, F_GETFL)", fd);
			return -1;
		}
		if (!(flags & O_NONBLOCK)) {
			if (fcntl(fd, F_SETFL, flags | O_NONBLOCK) == -1) {
				event_warn("fcntl(%d, F_SETFL)", fd);
				return -1;
			}
		}
	}
#endif
	return 0;
}